

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  undefined8 *puVar2;
  ulong uVar3;
  Option *pOVar4;
  Option *options;
  Option *buffer;
  Option *pOVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  Stats stats;
  Parser parse;
  IStringWriter local_40;
  undefined8 *local_38;
  
  iVar8 = argc - (uint)(0 < argc);
  option::Stats::Stats(&stats,true,usage,iVar8,argv + (0 < iVar8),0,false);
  uVar3 = (ulong)stats.options_max * 0x30;
  options = (Option *)operator_new__(uVar3);
  if ((ulong)stats.options_max != 0) {
    uVar7 = 0;
    do {
      lVar1 = (long)&options->next_ + uVar7 + 1;
      puVar2 = (undefined8 *)((long)&options->name + uVar7 + 4);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)((long)&options->desc + uVar7);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(long *)((long)&options->prev_ + uVar7) = lVar1;
      *(long *)((long)&options->next_ + uVar7) = lVar1;
      uVar7 = uVar7 + 0x30;
    } while (uVar3 != uVar7);
  }
  uVar3 = (ulong)stats.buffer_max * 0x30;
  buffer = (Option *)operator_new__(uVar3);
  if ((ulong)stats.buffer_max != 0) {
    uVar7 = 0;
    do {
      lVar1 = (long)&buffer->next_ + uVar7 + 1;
      puVar2 = (undefined8 *)((long)&buffer->name + uVar7 + 4);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)((long)&buffer->desc + uVar7);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(long *)((long)&buffer->prev_ + uVar7) = lVar1;
      *(long *)((long)&buffer->next_ + uVar7) = lVar1;
      uVar7 = uVar7 + 0x30;
    } while (uVar3 != uVar7);
  }
  option::Parser::Parser(&parse,true,usage,iVar8,argv + (0 < iVar8),options,buffer,0,false,-1);
  if (parse.err == false) {
    pOVar4 = options;
    do {
      pOVar5 = pOVar4;
      pOVar4 = pOVar5->prev_;
    } while (((ulong)pOVar5->prev_ & 1) == 0);
    iVar6 = -(uint)(options->desc == (Descriptor *)0x0);
    do {
      pOVar5 = pOVar5->next_;
      iVar6 = iVar6 + 1;
    } while (((ulong)pOVar5 & 1) == 0);
    if (parse.op_count != iVar6) {
      if ((iVar8 == 0) || (options[1].desc != (Descriptor *)0x0)) {
        local_40._vptr_IStringWriter = (_func_int **)&PTR_operator___00124d70;
        local_38 = &std::cout;
        option::PrintUsageImplementation::printUsage(&local_40,usage,0x50,0x32,0x4b);
      }
      else {
        if ((options[2].desc != (Descriptor *)0x0) || (options[3].desc != (Descriptor *)0x0)) {
          iVar8 = cli::extract(&parse,options);
          goto LAB_0010c943;
        }
        if (options[4].desc != (Descriptor *)0x0) {
          iVar8 = cli::pack(&parse,options);
          goto LAB_0010c943;
        }
      }
      iVar8 = 0;
      goto LAB_0010c943;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Invalid options\n",0x10)
  ;
  local_40._vptr_IStringWriter = (_func_int **)&PTR_operator___00124d70;
  local_38 = &std::cout;
  option::PrintUsageImplementation::printUsage(&local_40,usage,0x50,0x32,0x4b);
  iVar8 = 1;
LAB_0010c943:
  operator_delete__(buffer);
  operator_delete__(options);
  return iVar8;
}

Assistant:

int main(int argc, char *argv[])
{
	argc-=(argc>0); argv+=(argc>0); // Skip program name
	option::Stats stats(true, usage, argc, argv);
	std::unique_ptr<option::Option[]> options(new option::Option[stats.options_max]);
	std::unique_ptr<option::Option[]> buffer(new option::Option[stats.buffer_max]);
	option::Parser parse(true, usage, argc, argv, options.get(), buffer.get());

	if (parse.error() || (options[cli::UNKNOWN].count() == parse.optionsCount()))
	{
		std::cerr << "Invalid options\n";
		option::printUsage(std::cout, usage);
		return 1;
	}

	if (options[cli::HELP] || argc == 0)
	{
		option::printUsage(std::cout, usage);
		return 0;
	}

	if (options[cli::LIST] || options[cli::EXTRACT])
	{
		return cli::extract(parse, options.get());
	}
	else if (options[cli::PACK])
	{
		return cli::pack(parse, options.get());
	}

	return 0;
}